

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_insert_elim_pass.cpp
# Opt level: O3

void __thiscall
spvtools::opt::DeadInsertElimPass::MarkInsertChain
          (DeadInsertElimPass *this,Instruction *insertChain,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *pExtIndices,uint32_t extOffset,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *visited_phis)

{
  uint32_t uVar1;
  IRContext *pIVar2;
  long lVar3;
  __buckets_ptr pp_Var4;
  size_type sVar5;
  bool bVar6;
  uint32_t uVar7;
  Instruction *pIVar8;
  const_iterator cVar9;
  Op OVar10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pExtIndices_00;
  uint32_t *puVar11;
  uint uVar12;
  uint32_t *puVar13;
  DefUseManager *pDVar14;
  __node_base_ptr *pp_Var15;
  ulong uVar16;
  uint32_t *puVar17;
  __node_base_ptr *pp_Var18;
  uint32_t objId;
  uint uVar19;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ids;
  vector<unsigned_int,_std::allocator<unsigned_int>_> extIndices;
  __hashtable *__h;
  __hashtable *__h_3;
  uint local_b0;
  uint32_t local_ac;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_a8;
  __node_base_ptr *local_68;
  iterator iStack_60;
  uint *local_58;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_48;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_40;
  ulong local_38;
  
  pIVar2 = (this->super_MemPass).super_Pass.context_;
  local_40 = &visited_phis->_M_h;
  if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar2);
  }
  pDVar14 = (pIVar2->def_use_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  uVar7 = 0;
  if (insertChain->has_type_id_ == true) {
    uVar7 = Instruction::GetSingleWordOperand(insertChain,0);
  }
  pIVar8 = analysis::DefUseManager::GetDef(pDVar14,uVar7);
  if (pIVar8->opcode_ == OpTypeArray) {
    return;
  }
  OVar10 = insertChain->opcode_;
  if ((OVar10 != OpPhi) && (OVar10 != OpCompositeInsert)) {
    return;
  }
  if (pExtIndices == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    uVar7 = NumComponents(this,pIVar8);
    if (uVar7 != 0) {
      local_68 = (__node_base_ptr *)0x0;
      iStack_60._M_current = (uint32_t *)0x0;
      local_58 = (uint *)0x0;
      local_b0 = 0;
      do {
        if ((__node_base_ptr *)iStack_60._M_current != local_68) {
          iStack_60._M_current = (uint *)local_68;
        }
        if (iStack_60._M_current == local_58) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_68,iStack_60,
                     &local_b0);
        }
        else {
          *iStack_60._M_current = local_b0;
          iStack_60._M_current = iStack_60._M_current + 1;
        }
        local_a8._M_bucket_count = 1;
        local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_a8._M_element_count = 0;
        local_a8._M_rehash_policy._M_max_load_factor = 1.0;
        local_a8._M_rehash_policy._M_next_resize = 0;
        local_a8._M_single_bucket = (__node_base_ptr)0x0;
        local_a8._M_buckets = &local_a8._M_single_bucket;
        MarkInsertChain(this,insertChain,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68,0,
                        (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)&local_a8);
        std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&local_a8);
        local_b0 = local_b0 + 1;
      } while (local_b0 < uVar7);
      if (local_68 == (__node_base_ptr *)0x0) {
        return;
      }
      uVar16 = (long)local_58 - (long)local_68;
      pp_Var15 = local_68;
      goto LAB_0055086d;
    }
    OVar10 = insertChain->opcode_;
  }
  if (OVar10 == OpCompositeInsert) {
    local_48 = &this->liveInserts_;
    local_38 = (ulong)extOffset;
    local_ac = extOffset;
    do {
      if (pExtIndices != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        bVar6 = ExtInsMatch(pExtIndices,insertChain,extOffset);
        if (bVar6) {
          uVar7 = 0;
          if (insertChain->has_result_id_ == true) {
            uVar7 = Instruction::GetSingleWordOperand(insertChain,(uint)insertChain->has_type_id_);
          }
          local_68 = (__node_base_ptr *)CONCAT44(local_68._4_4_,uVar7);
          local_a8._M_buckets = (__buckets_ptr)local_48;
          std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    (local_48,(_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                               *)&local_68,&local_a8);
          uVar7 = (insertChain->has_result_id_ & 1) + 1;
          if (insertChain->has_type_id_ == false) {
            uVar7 = (uint)insertChain->has_result_id_;
          }
          uVar7 = Instruction::GetSingleWordOperand(insertChain,uVar7);
          local_a8._M_buckets = &local_a8._M_single_bucket;
          local_a8._M_bucket_count = 1;
          local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_a8._M_element_count = 0;
          local_a8._M_rehash_policy._M_max_load_factor = 1.0;
          local_a8._M_rehash_policy._M_next_resize = 0;
          local_a8._M_single_bucket = (__node_base_ptr)0x0;
          pIVar2 = (this->super_MemPass).super_Pass.context_;
          if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
            IRContext::BuildDefUseManager(pIVar2);
          }
          pIVar8 = analysis::DefUseManager::GetDef
                             ((pIVar2->def_use_mgr_)._M_t.
                              super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                              .
                              super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>
                              ._M_head_impl,uVar7);
          pExtIndices_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          uVar7 = 0;
        }
        else {
          bVar6 = ExtInsConflict(pExtIndices,insertChain,extOffset);
          if (!bVar6) goto LAB_005503f9;
          uVar7 = 0;
          if (insertChain->has_result_id_ == true) {
            uVar7 = Instruction::GetSingleWordOperand(insertChain,(uint)insertChain->has_type_id_);
          }
          local_68 = (__node_base_ptr *)CONCAT44(local_68._4_4_,uVar7);
          local_a8._M_buckets = (__buckets_ptr)local_48;
          std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    (local_48,(_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                               *)&local_68,&local_a8);
          uVar7 = (insertChain->has_result_id_ & 1) + 1;
          if (insertChain->has_type_id_ == false) {
            uVar7 = (uint)insertChain->has_result_id_;
          }
          uVar12 = ((int)((ulong)((long)(insertChain->operands_).
                                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(insertChain->operands_).
                                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                    -0x55555555 - uVar7) - 2;
          uVar16 = ((long)(pExtIndices->
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(pExtIndices->
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                          super__Vector_impl_data._M_start >> 2) - local_38;
          uVar7 = Instruction::GetSingleWordOperand(insertChain,uVar7);
          extOffset = local_ac;
          local_a8._M_buckets = &local_a8._M_single_bucket;
          if (uVar16 <= uVar12) {
            local_a8._M_bucket_count = 1;
            local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            local_a8._M_element_count = 0;
            local_a8._M_rehash_policy._M_max_load_factor = 1.0;
            local_a8._M_rehash_policy._M_next_resize = 0;
            local_a8._M_single_bucket = (__node_base_ptr)0x0;
            pIVar2 = (this->super_MemPass).super_Pass.context_;
            if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
              IRContext::BuildDefUseManager(pIVar2);
            }
            pDVar14 = (pIVar2->def_use_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                      _M_head_impl;
            goto LAB_005503d5;
          }
          local_a8._M_bucket_count = 1;
          local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_a8._M_element_count = 0;
          local_a8._M_rehash_policy._M_max_load_factor = 1.0;
          local_a8._M_rehash_policy._M_next_resize = 0;
          local_a8._M_single_bucket = (__node_base_ptr)0x0;
          pIVar2 = (this->super_MemPass).super_Pass.context_;
          if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
            IRContext::BuildDefUseManager(pIVar2);
          }
          pIVar8 = analysis::DefUseManager::GetDef
                             ((pIVar2->def_use_mgr_)._M_t.
                              super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                              .
                              super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>
                              ._M_head_impl,uVar7);
          uVar7 = uVar12 + local_ac;
          pExtIndices_00 = pExtIndices;
          extOffset = local_ac;
        }
        MarkInsertChain(this,pIVar8,pExtIndices_00,uVar7,
                        (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)&local_a8);
        std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&local_a8);
        OVar10 = insertChain->opcode_;
        break;
      }
      uVar7 = 0;
      if (insertChain->has_result_id_ == true) {
        uVar7 = Instruction::GetSingleWordOperand(insertChain,(uint)insertChain->has_type_id_);
      }
      local_68 = (__node_base_ptr *)CONCAT44(local_68._4_4_,uVar7);
      local_a8._M_buckets = (__buckets_ptr)local_48;
      std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                (local_48,(_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                           *)&local_68,&local_a8);
      uVar7 = (insertChain->has_result_id_ & 1) + 1;
      if (insertChain->has_type_id_ == false) {
        uVar7 = (uint)insertChain->has_result_id_;
      }
      uVar7 = Instruction::GetSingleWordOperand(insertChain,uVar7);
      local_a8._M_buckets = &local_a8._M_single_bucket;
      local_a8._M_bucket_count = 1;
      local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_a8._M_element_count = 0;
      local_a8._M_rehash_policy._M_max_load_factor = 1.0;
      local_a8._M_rehash_policy._M_next_resize = 0;
      local_a8._M_single_bucket = (__node_base_ptr)0x0;
      pIVar2 = (this->super_MemPass).super_Pass.context_;
      if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(pIVar2);
      }
      pDVar14 = (pIVar2->def_use_mgr_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl
      ;
LAB_005503d5:
      pIVar8 = analysis::DefUseManager::GetDef(pDVar14,uVar7);
      MarkInsertChain(this,pIVar8,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0,0,
                      (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)&local_a8);
      std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_a8);
LAB_005503f9:
      uVar12 = (insertChain->has_result_id_ & 1) + 1;
      if (insertChain->has_type_id_ == false) {
        uVar12 = (uint)insertChain->has_result_id_;
      }
      uVar7 = Instruction::GetSingleWordOperand(insertChain,uVar12 + 1);
      pIVar2 = (this->super_MemPass).super_Pass.context_;
      if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(pIVar2);
      }
      insertChain = analysis::DefUseManager::GetDef
                              ((pIVar2->def_use_mgr_)._M_t.
                               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                               .
                               super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>
                               ._M_head_impl,uVar7);
      OVar10 = insertChain->opcode_;
    } while (OVar10 == OpCompositeInsert);
  }
  if (OVar10 != OpPhi) {
    return;
  }
  uVar7 = 0;
  if (insertChain->has_result_id_ == true) {
    uVar7 = Instruction::GetSingleWordOperand(insertChain,(uint)insertChain->has_type_id_);
  }
  local_a8._M_buckets = (__buckets_ptr)CONCAT44(local_a8._M_buckets._4_4_,uVar7);
  cVar9 = std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(local_40,(key_type_conflict *)&local_a8);
  if (cVar9.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
    return;
  }
  uVar7 = 0;
  if (insertChain->has_result_id_ == true) {
    uVar7 = Instruction::GetSingleWordOperand(insertChain,(uint)insertChain->has_type_id_);
  }
  local_68 = (__node_base_ptr *)CONCAT44(local_68._4_4_,uVar7);
  local_a8._M_buckets = (__buckets_ptr)local_40;
  std::
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
            (local_40,(_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                       *)&local_68,&local_a8);
  local_a8._M_buckets = (__node_base_ptr *)0x0;
  local_a8._M_bucket_count = 0;
  local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  uVar12 = (insertChain->has_result_id_ & 1) + 1;
  if (insertChain->has_type_id_ == false) {
    uVar12 = (uint)insertChain->has_result_id_;
  }
  uVar19 = 0;
  if (uVar12 != (int)((ulong)((long)(insertChain->operands_).
                                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(insertChain->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555) {
    do {
      uVar7 = Instruction::GetSingleWordOperand(insertChain,uVar12 + uVar19);
      local_68 = (__node_base_ptr *)CONCAT44(local_68._4_4_,uVar7);
      if ((_Hash_node_base *)local_a8._M_bucket_count == local_a8._M_before_begin._M_nxt) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,
                   (iterator)local_a8._M_bucket_count,(uint *)&local_68);
      }
      else {
        *(uint32_t *)local_a8._M_bucket_count = uVar7;
        local_a8._M_bucket_count = local_a8._M_bucket_count + 4;
      }
      sVar5 = local_a8._M_bucket_count;
      pp_Var4 = local_a8._M_buckets;
      uVar19 = uVar19 + 2;
      uVar12 = (insertChain->has_result_id_ & 1) + 1;
      if (insertChain->has_type_id_ == false) {
        uVar12 = (uint)insertChain->has_result_id_;
      }
    } while (uVar19 < (int)((ulong)((long)(insertChain->operands_).
                                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(insertChain->operands_).
                                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                      -0x55555555 - uVar12);
    if (local_a8._M_buckets != (__buckets_ptr)local_a8._M_bucket_count) {
      uVar16 = (long)(local_a8._M_bucket_count - (long)local_a8._M_buckets) >> 2;
      lVar3 = 0x3f;
      if (uVar16 != 0) {
        for (; uVar16 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_a8._M_buckets,local_a8._M_bucket_count,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pp_Var4,sVar5);
    }
  }
  pp_Var15 = local_a8._M_buckets;
  pp_Var18 = local_a8._M_buckets;
  if (local_a8._M_buckets != (__buckets_ptr)local_a8._M_bucket_count) {
    puVar11 = (uint32_t *)((long)local_a8._M_buckets + 4);
    do {
      puVar13 = puVar11;
      pp_Var18 = (__node_base_ptr *)local_a8._M_bucket_count;
      if (puVar13 == (uint32_t *)local_a8._M_bucket_count) goto joined_r0x00550814;
      puVar11 = puVar13 + 1;
    } while (puVar13[-1] != *puVar13);
    puVar17 = puVar13 + -1;
    uVar7 = puVar13[-1];
    for (; puVar11 != (uint32_t *)local_a8._M_bucket_count; puVar11 = puVar11 + 1) {
      uVar1 = *puVar11;
      if (uVar7 != uVar1) {
        puVar17[1] = uVar1;
        puVar17 = puVar17 + 1;
      }
      uVar7 = uVar1;
    }
    pp_Var18 = (__node_base_ptr *)(puVar17 + 1);
  }
joined_r0x00550814:
  for (; pp_Var15 != pp_Var18; pp_Var15 = (__node_base_ptr *)((long)pp_Var15 + 4)) {
    pIVar2 = (this->super_MemPass).super_Pass.context_;
    if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(pIVar2);
    }
    pIVar8 = analysis::DefUseManager::GetDef
                       ((pIVar2->def_use_mgr_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                        .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                        _M_head_impl,*(uint32_t *)pp_Var15);
    MarkInsertChain(this,pIVar8,pExtIndices,extOffset,
                    (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)local_40);
  }
  if (local_a8._M_buckets == (__node_base_ptr *)0x0) {
    return;
  }
  uVar16 = (long)local_a8._M_before_begin._M_nxt - (long)local_a8._M_buckets;
  pp_Var15 = local_a8._M_buckets;
LAB_0055086d:
  operator_delete(pp_Var15,uVar16);
  return;
}

Assistant:

void DeadInsertElimPass::MarkInsertChain(
    Instruction* insertChain, std::vector<uint32_t>* pExtIndices,
    uint32_t extOffset, std::unordered_set<uint32_t>* visited_phis) {
  // Not currently optimizing array inserts.
  Instruction* typeInst = get_def_use_mgr()->GetDef(insertChain->type_id());
  if (typeInst->opcode() == spv::Op::OpTypeArray) return;
  // Insert chains are only composed of inserts and phis
  if (insertChain->opcode() != spv::Op::OpCompositeInsert &&
      insertChain->opcode() != spv::Op::OpPhi)
    return;
  // If extract indices are empty, mark all subcomponents if type
  // is constant length.
  if (pExtIndices == nullptr) {
    uint32_t cnum = NumComponents(typeInst);
    if (cnum > 0) {
      std::vector<uint32_t> extIndices;
      for (uint32_t i = 0; i < cnum; i++) {
        extIndices.clear();
        extIndices.push_back(i);
        std::unordered_set<uint32_t> sub_visited_phis;
        MarkInsertChain(insertChain, &extIndices, 0, &sub_visited_phis);
      }
      return;
    }
  }
  Instruction* insInst = insertChain;
  while (insInst->opcode() == spv::Op::OpCompositeInsert) {
    // If no extract indices, mark insert and inserted object (which might
    // also be an insert chain) and continue up the chain though the input
    // composite.
    //
    // Note: We mark inserted objects in this function (rather than in
    // EliminateDeadInsertsOnePass) because in some cases, we can do it
    // more accurately here.
    if (pExtIndices == nullptr) {
      liveInserts_.insert(insInst->result_id());
      uint32_t objId = insInst->GetSingleWordInOperand(kInsertObjectIdInIdx);
      std::unordered_set<uint32_t> obj_visited_phis;
      MarkInsertChain(get_def_use_mgr()->GetDef(objId), nullptr, 0,
                      &obj_visited_phis);
    // If extract indices match insert, we are done. Mark insert and
    // inserted object.
    } else if (ExtInsMatch(*pExtIndices, insInst, extOffset)) {
      liveInserts_.insert(insInst->result_id());
      uint32_t objId = insInst->GetSingleWordInOperand(kInsertObjectIdInIdx);
      std::unordered_set<uint32_t> obj_visited_phis;
      MarkInsertChain(get_def_use_mgr()->GetDef(objId), nullptr, 0,
                      &obj_visited_phis);
      break;
    // If non-matching intersection, mark insert
    } else if (ExtInsConflict(*pExtIndices, insInst, extOffset)) {
      liveInserts_.insert(insInst->result_id());
      // If more extract indices than insert, we are done. Use remaining
      // extract indices to mark inserted object.
      uint32_t numInsertIndices = insInst->NumInOperands() - 2;
      if (pExtIndices->size() - extOffset > numInsertIndices) {
        uint32_t objId = insInst->GetSingleWordInOperand(kInsertObjectIdInIdx);
        std::unordered_set<uint32_t> obj_visited_phis;
        MarkInsertChain(get_def_use_mgr()->GetDef(objId), pExtIndices,
                        extOffset + numInsertIndices, &obj_visited_phis);
        break;
      // If fewer extract indices than insert, also mark inserted object and
      // continue up chain.
      } else {
        uint32_t objId = insInst->GetSingleWordInOperand(kInsertObjectIdInIdx);
        std::unordered_set<uint32_t> obj_visited_phis;
        MarkInsertChain(get_def_use_mgr()->GetDef(objId), nullptr, 0,
                        &obj_visited_phis);
      }
    }
    // Get next insert in chain
    const uint32_t compId =
        insInst->GetSingleWordInOperand(kInsertCompositeIdInIdx);
    insInst = get_def_use_mgr()->GetDef(compId);
  }
  // If insert chain ended with phi, do recursive call on each operand
  if (insInst->opcode() != spv::Op::OpPhi) return;
  // Mark phi visited to prevent potential infinite loop. If phi is already
  // visited, return to avoid infinite loop.
  if (visited_phis->count(insInst->result_id()) != 0) return;
  visited_phis->insert(insInst->result_id());

  // Phis may have duplicate inputs values for different edges, prune incoming
  // ids lists before recursing.
  std::vector<uint32_t> ids;
  for (uint32_t i = 0; i < insInst->NumInOperands(); i += 2) {
    ids.push_back(insInst->GetSingleWordInOperand(i));
  }
  std::sort(ids.begin(), ids.end());
  auto new_end = std::unique(ids.begin(), ids.end());
  for (auto id_iter = ids.begin(); id_iter != new_end; ++id_iter) {
    Instruction* pi = get_def_use_mgr()->GetDef(*id_iter);
    MarkInsertChain(pi, pExtIndices, extOffset, visited_phis);
  }
}